

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetGlyphBox(stbtt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  stbtt_int16 sVar1;
  int iVar2;
  int g;
  int *y1_local;
  int *x1_local;
  int *y0_local;
  int *x0_local;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  if ((info->cff).size == 0) {
    iVar2 = stbtt__GetGlyfOffset(info,glyph_index);
    if (iVar2 < 0) {
      return 0;
    }
    if (x0 != (int *)0x0) {
      sVar1 = ttSHORT(info->data + (long)iVar2 + 2);
      *x0 = (int)sVar1;
    }
    if (y0 != (int *)0x0) {
      sVar1 = ttSHORT(info->data + (long)iVar2 + 4);
      *y0 = (int)sVar1;
    }
    if (x1 != (int *)0x0) {
      sVar1 = ttSHORT(info->data + (long)iVar2 + 6);
      *x1 = (int)sVar1;
    }
    if (y1 != (int *)0x0) {
      sVar1 = ttSHORT(info->data + (long)iVar2 + 8);
      *y1 = (int)sVar1;
    }
  }
  else {
    stbtt__GetGlyphInfoT2(info,glyph_index,x0,y0,x1,y1);
  }
  return 1;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphBox(const stbtt_fontinfo *info, int glyph_index, int *x0, int *y0, int *x1, int *y1)
{
   if (info->cff.size) {
      stbtt__GetGlyphInfoT2(info, glyph_index, x0, y0, x1, y1);
   } else {
      int g = stbtt__GetGlyfOffset(info, glyph_index);
      if (g < 0) return 0;

      if (x0) *x0 = ttSHORT(info->data + g + 2);
      if (y0) *y0 = ttSHORT(info->data + g + 4);
      if (x1) *x1 = ttSHORT(info->data + g + 6);
      if (y1) *y1 = ttSHORT(info->data + g + 8);
   }
   return 1;
}